

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::link::unlink<libtorrent::aux::torrent>
          (link *this,vector<libtorrent::aux::torrent_*> *list,torrent_list_index_t link_index)

{
  int iVar1;
  value_type ptVar2;
  size_type sVar3;
  value_type *pptVar4;
  value_type *pvVar5;
  int idx;
  int last;
  vector<libtorrent::aux::torrent_*> *list_local;
  link *this_local;
  torrent_list_index_t link_index_local;
  
  if (this->index != -1) {
    sVar3 = ::std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::
            size(&list->
                  super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                );
    idx = (int)sVar3 + -1;
    if (this->index < idx) {
      iVar1 = this->index;
      pptVar4 = container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
                ::operator[](list,idx);
      pvVar5 = container_wrapper<libtorrent::aux::link,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>,_std::array<libtorrent::aux::link,_8UL>_>
               ::operator[](&(*pptVar4)->m_links,
                            (strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>)
                            link_index.m_val);
      pvVar5->index = iVar1;
      pptVar4 = container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
                ::operator[](list,idx);
      ptVar2 = *pptVar4;
      pptVar4 = container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
                ::operator[](list,this->index);
      *pptVar4 = ptVar2;
    }
    container_wrapper<libtorrent::aux::torrent*,int,std::vector<libtorrent::aux::torrent*,std::allocator<libtorrent::aux::torrent*>>>
    ::resize<int,void>((container_wrapper<libtorrent::aux::torrent*,int,std::vector<libtorrent::aux::torrent*,std::allocator<libtorrent::aux::torrent*>>>
                        *)list,idx);
    this->index = -1;
  }
  return;
}

Assistant:

void unlink(aux::vector<T*>& list
			, torrent_list_index_t const link_index)
		{
			if (index == -1) return;
			TORRENT_ASSERT(index >= 0 && index < int(list.size()));
			int const last = int(list.size()) - 1;
			if (index < last)
			{
				list[last]->m_links[link_index].index = index;
				list[index] = list[last];
			}
			list.resize(last);
			index = -1;
		}